

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O3

int fsi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x10);
  pdVar5 = *(double **)((long)y->content + 0x10);
  dVar3 = *pdVar5;
  dVar4 = pdVar5[1];
  dVar6 = cos(t);
  dVar7 = cos(t * *(double *)((long)user_data + 8));
  pdVar5 = *(double **)((long)ydot->content + 0x10);
  *pdVar5 = (((dVar4 * dVar4 + -2.0) - dVar7) / (dVar4 + dVar4)) * dVar2 +
            ((dVar6 * -0.5 + dVar3 * dVar3 + -1.0) / (dVar3 + dVar3)) * dVar1;
  pdVar5[1] = 0.0;
  return 0;
}

Assistant:

static int fsi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);
  sunrealtype tmp1, tmp2;

  /* fill in the slow implicit RHS function:
     [G e]*[(-1+u^2-r(t))/(2*u))]
     [0 0] [(-2+v^2-s(t))/(2*v)]  */
  tmp1              = (-ONE + u * u - r(t, rpar)) / (TWO * u);
  tmp2              = (-TWO + v * v - s(t, rpar)) / (TWO * v);
  NV_Ith_S(ydot, 0) = G * tmp1 + e * tmp2;
  NV_Ith_S(ydot, 1) = ZERO;

  /* Return with success */
  return 0;
}